

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_cbc.c
# Opt level: O1

void beltCBCStepE(void *buf,size_t count,void *state)

{
  ulong *block;
  
  if (0xf < count) {
    do {
      *(ulong *)((long)state + 0x20) = *(ulong *)((long)state + 0x20) ^ *buf;
      *(ulong *)((long)state + 0x28) = *(ulong *)((long)state + 0x28) ^ *(ulong *)((long)buf + 8);
      beltBlockEncr((octet *)((long)state + 0x20),(u32 *)state);
      *(ulong *)buf = *(ulong *)((long)state + 0x20);
      *(ulong *)((long)buf + 8) = *(ulong *)((long)state + 0x28);
      buf = (void *)((long)buf + 0x10);
      count = count - 0x10;
    } while (0xf < count);
  }
  if (count != 0) {
    block = (ulong *)((long)buf + -0x10);
    memSwap(block,buf,count);
    memXor2(block,(void *)((long)state + 0x20),count);
    beltBlockEncr((octet *)block,(u32 *)state);
    return;
  }
  return;
}

Assistant:

void beltCBCStepE(void* buf, size_t count, void* state)
{
	belt_cbc_st* st = (belt_cbc_st*)state;
	ASSERT(count >= 16);
	ASSERT(memIsDisjoint2(buf, count, state, beltCBC_keep()));
	// цикл по полным блокам
	while(count >= 16)
	{
		beltBlockXor2(st->block, buf);
		beltBlockEncr(st->block, st->key);
		beltBlockCopy(buf, st->block);
		buf = (octet*)buf + 16;
		count -= 16;
	}
	// неполный блок? кража блока
	if (count)
	{
		memSwap((octet*)buf - 16, buf, count);
		memXor2((octet*)buf - 16, st->block, count);
		beltBlockEncr((octet*)buf - 16, st->key);
	}
}